

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_filename
sqlite3_create_filename(char *zDatabase,char *zJournal,char *zWal,int nParam,char **azParam)

{
  char *pcVar1;
  void *__s;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_R8;
  char *p;
  char *pResult;
  int i;
  sqlite3_int64 nByte;
  char *in_stack_ffffffffffffff98;
  char *local_50;
  int local_3c;
  sqlite3_filename local_8;
  
  pcVar1 = (char *)strlen(in_RDI);
  strlen(in_RSI);
  strlen(in_RDX);
  for (local_3c = 0; SBORROW4(local_3c,in_ECX * 2) != local_3c + in_ECX * -2 < 0;
      local_3c = local_3c + 1) {
    strlen(*(char **)(in_R8 + (long)local_3c * 8));
  }
  __s = sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffff98);
  if (__s == (void *)0x0) {
    local_8 = (sqlite3_filename)0x0;
  }
  else {
    memset(__s,0,4);
    local_50 = appendText(pcVar1,in_stack_ffffffffffffff98);
    for (local_3c = 0; SBORROW4(local_3c,in_ECX * 2) != local_3c + in_ECX * -2 < 0;
        local_3c = local_3c + 1) {
      local_50 = appendText(pcVar1,in_stack_ffffffffffffff98);
    }
    *local_50 = '\0';
    appendText(pcVar1,in_stack_ffffffffffffff98);
    pcVar1 = appendText(pcVar1,in_stack_ffffffffffffff98);
    *pcVar1 = '\0';
    pcVar1[1] = '\0';
    local_8 = (sqlite3_filename)((long)__s + 4);
  }
  return local_8;
}

Assistant:

SQLITE_API const char *sqlite3_create_filename(
  const char *zDatabase,
  const char *zJournal,
  const char *zWal,
  int nParam,
  const char **azParam
){
  sqlite3_int64 nByte;
  int i;
  char *pResult, *p;
  nByte = strlen(zDatabase) + strlen(zJournal) + strlen(zWal) + 10;
  for(i=0; i<nParam*2; i++){
    nByte += strlen(azParam[i])+1;
  }
  pResult = p = sqlite3_malloc64( nByte );
  if( p==0 ) return 0;
  memset(p, 0, 4);
  p += 4;
  p = appendText(p, zDatabase);
  for(i=0; i<nParam*2; i++){
    p = appendText(p, azParam[i]);
  }
  *(p++) = 0;
  p = appendText(p, zJournal);
  p = appendText(p, zWal);
  *(p++) = 0;
  *(p++) = 0;
  assert( (sqlite3_int64)(p - pResult)==nByte );
  return pResult + 4;
}